

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::CompilerGLSL::should_force_emit_builtin_block
          (CompilerGLSL *this,StorageClass storage)

{
  size_t sVar1;
  Variant *pVVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ExecutionModel EVar7;
  SPIRVariable *var;
  SPIRType *pSVar8;
  TypedID<(diligent_spirv_cross::Types)0> *id;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar9;
  bool bVar10;
  uint32_t index;
  LoopLock local_40;
  TypedID<(diligent_spirv_cross::Types)0> *local_38;
  
  if (storage == Output) {
    ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
    sVar1 = (this->super_Compiler).ir.ids_for_type[2].
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
            buffer_size;
    if (sVar1 == 0) {
      bVar10 = false;
    }
    else {
      pTVar9 = (this->super_Compiler).ir.ids_for_type[2].
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
      local_38 = pTVar9 + sVar1;
      bVar10 = false;
      do {
        pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
        if ((pVVar2[pTVar9->id].type == TypeVariable) &&
           (var = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar2 + pTVar9->id), !bVar10)) {
          pSVar8 = Variant::get<diligent_spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.
                              super_VectorView<diligent_spirv_cross::Variant>.ptr +
                              *(uint *)&(var->super_IVariant).field_0xc);
          bVar3 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(pSVar8->super_IVariant).self.id,Block);
          if ((bVar3 && var->storage == Output) &&
             (bVar4 = Compiler::is_builtin_variable(&this->super_Compiler,var), bVar4)) {
            uVar6 = (uint32_t)
                    (pSVar8->member_types).
                    super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                    .buffer_size;
            if (uVar6 != 0) {
              index = 0;
              do {
                bVar3 = Compiler::has_member_decoration
                                  (&this->super_Compiler,(TypeID)(pSVar8->super_IVariant).self.id,
                                   index,BuiltIn);
                if ((((bVar3) &&
                     (uVar5 = Compiler::get_member_decoration
                                        (&this->super_Compiler,
                                         (TypeID)(pSVar8->super_IVariant).self.id,index,BuiltIn),
                     uVar5 < 5)) && (uVar5 != 2)) &&
                   (bVar3 = Compiler::has_member_decoration
                                      (&this->super_Compiler,
                                       (TypeID)(pSVar8->super_IVariant).self.id,index,
                                       DecorationOffset), bVar3)) {
                  bVar10 = true;
                }
                index = index + 1;
              } while (uVar6 != index);
            }
          }
          else if (((!bVar3 && var->storage == Output) &&
                   (bVar3 = Compiler::is_builtin_variable(&this->super_Compiler,var), bVar3)) &&
                  ((uVar6 = Compiler::get_decoration
                                      (&this->super_Compiler,(ID)(pSVar8->super_IVariant).self.id,
                                       BuiltIn), uVar6 < 5 &&
                   ((uVar6 != 2 &&
                    (bVar3 = Compiler::has_decoration
                                       (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                        DecorationOffset), bVar3)))))) {
            bVar10 = true;
          }
        }
        pTVar9 = pTVar9 + 1;
      } while (pTVar9 != local_38);
    }
    ParsedIR::LoopLock::~LoopLock(&local_40);
    EVar7 = Compiler::get_execution_model(&this->super_Compiler);
    if (((EVar7 == ExecutionModelTessellationControl) ||
        (EVar7 = Compiler::get_execution_model(&this->super_Compiler), bVar3 = bVar10,
        EVar7 == ExecutionModelMeshEXT)) &&
       (bVar3 = true,
       (this->super_Compiler).cull_distance_count == 0 &&
       (this->super_Compiler).clip_distance_count == 0)) {
      bVar3 = bVar10;
    }
    EVar7 = Compiler::get_execution_model(&this->super_Compiler);
    bVar3 = (bool)(EVar7 == ExecutionModelMeshEXT & (this->super_Compiler).position_invariant |
                  bVar3);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CompilerGLSL::should_force_emit_builtin_block(StorageClass storage)
{
	// If the builtin block uses XFB, we need to force explicit redeclaration of the builtin block.

	if (storage != StorageClassOutput)
		return false;
	bool should_force = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (should_force)
			return;

		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t member_count = uint32_t(type.member_types.size());
			for (uint32_t i = 0; i < member_count; i++)
			{
				if (has_member_decoration(type.self, i, DecorationBuiltIn) &&
				    is_block_builtin(BuiltIn(get_member_decoration(type.self, i, DecorationBuiltIn))) &&
				    has_member_decoration(type.self, i, DecorationOffset))
				{
					should_force = true;
				}
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			if (is_block_builtin(BuiltIn(get_decoration(type.self, DecorationBuiltIn))) &&
			    has_decoration(var.self, DecorationOffset))
			{
				should_force = true;
			}
		}
	});

	// If we're declaring clip/cull planes with control points we need to force block declaration.
	if ((get_execution_model() == ExecutionModelTessellationControl ||
	     get_execution_model() == ExecutionModelMeshEXT) &&
	    (clip_distance_count || cull_distance_count))
	{
		should_force = true;
	}

	// Either glslang bug or oversight, but global invariant position does not work in mesh shaders.
	if (get_execution_model() == ExecutionModelMeshEXT && position_invariant)
		should_force = true;

	return should_force;
}